

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O0

void __thiscall
CrashTest_DISABLED_MemoryTest_Test::TestBody(CrashTest_DISABLED_MemoryTest_Test *this)

{
  bool bVar1;
  AssertHelper local_38;
  Message local_30 [3];
  byte local_11;
  CrashTest_DISABLED_MemoryTest_Test *pCStack_10;
  bool gtest_caught_any;
  CrashTest_DISABLED_MemoryTest_Test *this_local;
  
  pCStack_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_11 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MemoryOverflow();
    }
    if ((local_11 & 1) != 0) {
      return;
    }
  }
  testing::Message::Message(local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x26,"Expected: MemoryOverflow() throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=(&local_38,local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::Message::~Message(local_30);
  return;
}

Assistant:

TEST (CrashTest, DISABLED_MemoryTest) {
    ASSERT_ANY_THROW(MemoryOverflow());
}